

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O3

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int *piVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  byte bVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  Reduction *pRVar18;
  Reduction *pRVar19;
  Reduction *pRVar20;
  uint uVar21;
  Reduction *pRVar22;
  byte bVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  long lVar28;
  void *pvVar29;
  Reduction *pRVar30;
  int iVar31;
  uint uVar32;
  Reduction *pRVar33;
  Reduction *pRVar34;
  Reduction *pRVar35;
  size_t sVar36;
  Reduction *pRVar37;
  size_t sVar38;
  float *pfVar39;
  float *pfVar40;
  void *pvVar41;
  float *pfVar42;
  ulong uVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  float fVar48;
  float fVar49;
  int iVar59;
  undefined4 uVar60;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar61 [16];
  float fVar62;
  int axes_flag [4];
  int local_18c;
  Reduction *local_188;
  float *local_178;
  float *local_168;
  float *local_150;
  byte local_148;
  float *local_130;
  Reduction *local_f8;
  void *local_e0;
  byte local_d8;
  byte bStack_d0;
  undefined1 uStack_cf;
  undefined2 uStack_ce;
  undefined1 local_98 [84];
  int iStack_44;
  Mat *pMVar27;
  
  uVar21 = bottom_blob->dims;
  stack0xffffffffffffffb8 = (undefined1  [16])0x0;
  if (this->reduce_all != 0) {
    iVar15 = 1;
    iVar59 = 0;
    iVar17 = 1;
    uVar60 = 0;
    bVar45 = true;
    bVar44 = true;
    goto LAB_00324f93;
  }
  lVar28 = (long)(this->axes).w;
  if (0 < lVar28) {
    pvVar29 = (this->axes).data;
    lVar24 = 0;
    do {
      iVar15 = *(int *)((long)pvVar29 + lVar24 * 4);
      *(undefined4 *)(local_98 + (long)(int)((iVar15 >> 0x1f & uVar21) + iVar15) * 4 + 0x50) = 1;
      lVar24 = lVar24 + 1;
    } while (lVar28 != lVar24);
  }
  iVar17 = local_98._88_4_;
  switch(uVar21) {
  case 1:
    iVar15 = 0;
    iVar59 = 0;
    iVar17 = 1;
    uVar60 = 0;
    break;
  case 2:
    iVar15 = -(uint)(local_98._80_4_ == 1);
    iVar59 = -(uint)(iStack_44 == 1);
    iVar17 = -(uint)(iStack_44 == 1);
    uVar60 = 0xffffffff;
    break;
  case 3:
    bVar44 = local_98._80_4_ == 1;
    iVar15 = -(uint)(iStack_44 == 1);
    iVar59 = -(uint)(iVar17 == 1);
    iVar17 = -(uint)(iVar17 == 1);
    uVar60 = 0xffffffff;
    bVar45 = false;
    goto LAB_00324f93;
  case 4:
    bVar44 = local_98._80_4_ == 1;
    bVar45 = iStack_44 == 1;
    iVar15 = -(uint)(iVar17 == 1);
    iVar59 = -(uint)(local_98._92_4_ == 1);
    iVar17 = -(uint)(local_98._92_4_ == 1);
    uVar60 = 0xffffffff;
    goto LAB_00324f93;
  default:
    iVar15 = 0;
    iVar59 = 0;
    iVar17 = 0;
    uVar60 = 0;
  }
  bVar45 = false;
  bVar44 = false;
LAB_00324f93:
  local_d8 = (byte)iVar15;
  bStack_d0 = (byte)iVar17;
  uStack_cf = (undefined1)((uint)iVar17 >> 8);
  uStack_ce = (undefined2)((uint)iVar17 >> 0x10);
  iVar17 = this->operation;
  if (iVar17 - 1U < 10) {
    uVar43 = (ulong)(iVar17 - 1U);
    fVar48 = *(float *)(&DAT_005abdc4 + uVar43 * 4);
    pRVar33 = (Reduction *)(ulong)*(uint *)(&DAT_005abdec + uVar43 * 4);
    local_18c = *(int *)(&DAT_005abe14 + uVar43 * 4);
  }
  else {
    pRVar33 = (Reduction *)0x0;
    fVar48 = 0.0;
    local_18c = 0;
  }
  fVar62 = this->coeff;
  sVar3 = bottom_blob->elemsize;
  if (uVar21 == 1) {
    uVar32 = bottom_blob->w;
    Mat::create(top_blob,1,sVar3,opt->blob_allocator);
    this = (Reduction *)bottom_blob->data;
    pRVar33 = (Reduction *)(ulong)uVar32;
    fVar48 = reduction(fVar48,(float *)this,uVar32,local_18c);
    *(float *)top_blob->data = fVar48;
    bVar9 = false;
    bVar46 = false;
    bVar47 = false;
  }
  else {
    iVar31 = (int)pRVar33;
    uVar32 = this->keepdims;
    bVar46 = uVar21 == 2;
    pMVar27 = top_blob;
    if (bVar46) {
      uVar16 = bottom_blob->w;
      pRVar22 = (Reduction *)(ulong)uVar16;
      uVar1 = bottom_blob->h;
      pRVar19 = (Reduction *)(ulong)uVar1;
      auVar50._8_4_ = 0xffffffff;
      auVar50._0_8_ = 0xffffffffffffffff;
      auVar50._12_4_ = 0xffffffff;
      auVar61._4_4_ = iVar59;
      auVar61._0_4_ = iVar15;
      auVar61[8] = bStack_d0;
      auVar61[9] = uStack_cf;
      auVar61._10_2_ = uStack_ce;
      auVar61._12_4_ = uVar60;
      auVar51._0_8_ = SUB168(auVar50 ^ auVar61,0) << 0x3f;
      auVar51._8_8_ = SUB168(auVar50 ^ auVar61,8) << 0x3f;
      uVar25 = movmskpd((int)top_blob,auVar51);
      if (uVar25 == 0) {
        if (uVar32 == 0) {
          Mat::create(top_blob,1,sVar3,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,sVar3,opt->blob_allocator);
        }
        local_98._64_8_ = 0;
        local_98._0_8_ = (Reduction *)0x0;
        local_98[8] = false;
        local_98[9] = false;
        local_98[10] = false;
        local_98[0xb] = false;
        local_98[0xc] = false;
        local_98[0xd] = false;
        local_98[0xe] = false;
        local_98[0xf] = false;
        local_98[0x10] = false;
        local_98[0x11] = false;
        local_98[0x12] = false;
        local_98[0x13] = false;
        local_98[0x14] = false;
        local_98[0x15] = false;
        local_98[0x16] = false;
        local_98[0x17] = false;
        local_98._24_4_ = 0;
        local_98._32_8_ = (Reduction *)0x0;
        local_98._40_4_ = 0;
        local_98._44_4_ = 0;
        local_98._48_4_ = 0;
        local_98._52_4_ = 0;
        local_98._56_4_ = 0;
        Mat::create((Mat *)local_98,uVar1,sVar3,opt->workspace_allocator);
        this = (Reduction *)local_98._0_8_;
        if (((Reduction *)local_98._0_8_ == (Reduction *)0x0) ||
           ((long)(int)local_98._56_4_ * local_98._64_8_ == 0)) {
          piVar8 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
          if (piVar8 == (int *)0x0) {
            return -100;
          }
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 != 0) {
            return -100;
          }
          if ((Reduction *)local_98._32_8_ != (Reduction *)0x0) {
            (*((Layer *)local_98._32_8_)->_vptr_Layer[3])();
            return -100;
          }
          goto LAB_003264ff;
        }
        if (0 < (int)uVar1) {
          pfVar39 = (float *)bottom_blob->data;
          iVar2 = bottom_blob->w;
          sVar38 = bottom_blob->elemsize;
          pRVar33 = (Reduction *)0x0;
          do {
            fVar49 = reduction(fVar48,pfVar39,uVar16,local_18c);
            *(float *)((long)&(this->super_Layer)._vptr_Layer + (long)pRVar33 * 4) = fVar49;
            pRVar33 = (Reduction *)((long)&(pRVar33->super_Layer)._vptr_Layer + 1);
            pfVar39 = (float *)((long)pfVar39 + (long)iVar2 * sVar38);
          } while (pRVar19 != pRVar33);
        }
        pRVar33 = pRVar19;
        fVar49 = reduction(fVar48,(float *)this,uVar1,iVar31);
        *(float *)top_blob->data = fVar49;
        piVar8 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            this = (Reduction *)local_98._32_8_;
            pRVar33 = (Reduction *)local_98._0_8_;
            if ((Reduction *)local_98._32_8_ == (Reduction *)0x0) {
              if ((Reduction *)local_98._0_8_ != (Reduction *)0x0) {
                this = (Reduction *)local_98._0_8_;
                free((void *)local_98._0_8_);
              }
            }
            else {
              (*((Layer *)local_98._32_8_)->_vptr_Layer[3])();
            }
          }
        }
      }
      pMVar27 = (Mat *)(ulong)uVar25;
      if (((auVar61[0] | (byte)(uVar25 >> 1) & 0x7f) & 1) == 0) {
        if (uVar32 == 0) {
          pRVar33 = pRVar19;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar1,sVar3,opt->blob_allocator);
        }
        else {
          pRVar33 = (Reduction *)0x1;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,1,uVar1,sVar3,opt->blob_allocator);
        }
        if (0 < (int)uVar1) {
          pRVar18 = (Reduction *)bottom_blob->data;
          iVar2 = bottom_blob->w;
          sVar38 = bottom_blob->elemsize;
          pMVar27 = (Mat *)top_blob->data;
          pRVar34 = (Reduction *)0x0;
          do {
            pRVar33 = pRVar22;
            this = pRVar18;
            fVar49 = reduction(fVar48,(float *)pRVar18,uVar16,local_18c);
            *(float *)((long)&pMVar27->data + (long)pRVar34 * 4) = fVar49;
            pRVar34 = (Reduction *)((long)&(pRVar34->super_Layer)._vptr_Layer + 1);
            pRVar18 = (Reduction *)
                      ((long)&(pRVar18->super_Layer)._vptr_Layer + (long)iVar2 * sVar38);
          } while (pRVar19 != pRVar34);
        }
      }
      local_148 = (byte)uVar25;
      if (((bStack_d0 | local_148) & 1) == 0) {
        if (uVar32 == 0) {
          pRVar33 = pRVar22;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar16,sVar3,opt->blob_allocator);
        }
        else {
          pRVar33 = pRVar22;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar16,1,sVar3,opt->blob_allocator);
        }
        if (0 < (int)uVar16) {
          pvVar29 = bottom_blob->data;
          iVar2 = bottom_blob->w;
          pvVar41 = top_blob->data;
          pMVar27 = (Mat *)0x0;
          do {
            this = (Reduction *)((long)&pMVar27->data + (long)pvVar29);
            pRVar33 = pRVar19;
            fVar49 = reduction(fVar48,(float *)this,uVar1,iVar2,local_18c);
            *(float *)((long)&pMVar27->data + (long)pvVar41) = fVar49;
            pMVar27 = (Mat *)((long)&pMVar27->data + 4);
          } while ((Mat *)((long)pRVar22 * 4) != pMVar27);
        }
      }
    }
    bVar47 = uVar21 == 3;
    if (bVar47) {
      uVar16 = bottom_blob->w;
      uVar1 = bottom_blob->h;
      pRVar19 = (Reduction *)(ulong)uVar1;
      uVar25 = bottom_blob->c;
      pRVar22 = (Reduction *)(ulong)uVar25;
      uVar14 = uVar1 * uVar16;
      auVar52._8_4_ = 0xffffffff;
      auVar52._0_8_ = 0xffffffffffffffff;
      auVar52._12_4_ = 0xffffffff;
      auVar6._4_4_ = iVar59;
      auVar6._0_4_ = iVar15;
      auVar6[8] = bStack_d0;
      auVar6[9] = uStack_cf;
      auVar6._10_2_ = uStack_ce;
      auVar6._12_4_ = uVar60;
      auVar53._0_8_ = SUB168(auVar52 ^ auVar6,0) << 0x3f;
      auVar53._8_8_ = SUB168(auVar52 ^ auVar6,8) << 0x3f;
      uVar26 = movmskpd((int)pMVar27,auVar53);
      uVar43 = (ulong)uVar26;
      bVar9 = (bool)(bVar44 ^ 1);
      if ((uVar26 == 0) && (!bVar9)) {
        if (uVar32 == 0) {
          Mat::create(top_blob,1,sVar3,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,1,sVar3,opt->blob_allocator);
        }
        local_98._64_8_ = 0;
        local_98._0_8_ = (Reduction *)0x0;
        local_98[8] = false;
        local_98[9] = false;
        local_98[10] = false;
        local_98[0xb] = false;
        local_98[0xc] = false;
        local_98[0xd] = false;
        local_98[0xe] = false;
        local_98[0xf] = false;
        local_98[0x10] = false;
        local_98[0x11] = false;
        local_98[0x12] = false;
        local_98[0x13] = false;
        local_98[0x14] = false;
        local_98[0x15] = false;
        local_98[0x16] = false;
        local_98[0x17] = false;
        local_98._24_4_ = 0;
        local_98._32_8_ = (Reduction *)0x0;
        local_98._40_4_ = 0;
        local_98._44_4_ = 0;
        local_98._48_4_ = 0;
        local_98._52_4_ = 0;
        local_98._56_4_ = 0;
        Mat::create((Mat *)local_98,uVar25,sVar3,opt->workspace_allocator);
        this = (Reduction *)local_98._0_8_;
        if (((Reduction *)local_98._0_8_ == (Reduction *)0x0) ||
           ((long)(int)local_98._56_4_ * local_98._64_8_ == 0)) {
          piVar8 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
          if (piVar8 == (int *)0x0) {
            return -100;
          }
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 != 0) {
            return -100;
          }
          if ((Reduction *)local_98._32_8_ != (Reduction *)0x0) {
            (*((Layer *)local_98._32_8_)->_vptr_Layer[3])();
            return -100;
          }
          goto LAB_003264ff;
        }
        if (0 < (int)uVar25) {
          pfVar39 = (float *)bottom_blob->data;
          sVar38 = bottom_blob->elemsize;
          sVar36 = bottom_blob->cstep;
          pRVar33 = (Reduction *)0x0;
          do {
            fVar49 = reduction(fVar48,pfVar39,uVar14,local_18c);
            *(float *)((long)&(this->super_Layer)._vptr_Layer + (long)pRVar33 * 4) = fVar49;
            pRVar33 = (Reduction *)((long)&(pRVar33->super_Layer)._vptr_Layer + 1);
            pfVar39 = (float *)((long)pfVar39 + sVar38 * sVar36);
          } while (pRVar22 != pRVar33);
        }
        pRVar33 = (Reduction *)(ulong)uVar25;
        fVar49 = reduction(fVar48,(float *)this,uVar25,iVar31);
        *(float *)top_blob->data = fVar49;
        piVar8 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
        uVar43 = 0;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            this = (Reduction *)local_98._32_8_;
            pRVar33 = (Reduction *)local_98._0_8_;
            if ((Reduction *)local_98._32_8_ == (Reduction *)0x0) {
              if ((Reduction *)local_98._0_8_ != (Reduction *)0x0) {
                this = (Reduction *)local_98._0_8_;
                free((void *)local_98._0_8_);
              }
            }
            else {
              (*((Layer *)local_98._32_8_)->_vptr_Layer[3])();
            }
          }
        }
      }
      pRVar18 = (Reduction *)(ulong)uVar16;
      local_150._0_1_ = (byte)(uVar43 >> 1) & 0x7f;
      if (uVar26 == 0 && !bVar44) {
        if (uVar32 == 0) {
          pRVar33 = pRVar22;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar25,sVar3,opt->blob_allocator);
        }
        else {
          pRVar33 = (Reduction *)0x1;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,1,1,uVar25,sVar3,opt->blob_allocator);
        }
        if (0 < (int)uVar25) {
          pRVar33 = (Reduction *)bottom_blob->data;
          sVar38 = bottom_blob->elemsize;
          pfVar39 = (float *)top_blob->data;
          sVar36 = top_blob->elemsize;
          sVar4 = top_blob->cstep;
          sVar5 = bottom_blob->cstep;
          pRVar34 = pRVar22;
          pfVar42 = pfVar39;
          do {
            pfVar40 = pfVar39;
            if (uVar32 == 0) {
              pfVar40 = pfVar42;
            }
            this = pRVar33;
            fVar49 = reduction(fVar48,(float *)pRVar33,uVar14,local_18c);
            *pfVar40 = fVar49;
            pfVar39 = (float *)((long)pfVar39 + sVar36 * sVar4);
            pfVar42 = pfVar42 + 1;
            pRVar33 = (Reduction *)((long)&(pRVar33->super_Layer)._vptr_Layer + sVar38 * sVar5);
            pRVar34 = (Reduction *)&pRVar34[-1].field_0x12f;
          } while (pRVar34 != (Reduction *)0x0);
        }
      }
      if ((((byte)local_150 | local_d8) & 1) == 0 && !bVar9) {
        if (uVar32 == 0) {
          pRVar33 = pRVar19;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar1,sVar3,opt->blob_allocator);
        }
        else {
          pRVar33 = (Reduction *)0x1;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,1,uVar1,1,sVar3,opt->blob_allocator);
        }
        if (0 < (int)uVar1) {
          iVar2 = bottom_blob->w;
          sVar38 = bottom_blob->elemsize;
          pRVar34 = (Reduction *)bottom_blob->data;
          sVar36 = bottom_blob->cstep;
          pvVar29 = top_blob->data;
          pRVar20 = (Reduction *)0x0;
          do {
            pRVar33 = pRVar18;
            this = pRVar34;
            fVar49 = reduction(fVar48,(float *)pRVar34,uVar16,uVar25,(int)sVar36,local_18c);
            *(float *)((long)pvVar29 + (long)pRVar20 * 4) = fVar49;
            pRVar20 = (Reduction *)((long)&(pRVar20->super_Layer)._vptr_Layer + 1);
            pRVar34 = (Reduction *)
                      ((long)&(pRVar34->super_Layer)._vptr_Layer + (long)iVar2 * sVar38);
          } while (pRVar19 != pRVar20);
        }
      }
      bVar12 = (byte)uVar43 | bStack_d0;
      if ((bVar12 & 1) == 0 && !bVar9) {
        if (uVar32 == 0) {
          pRVar33 = (Reduction *)(ulong)uVar16;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar16,sVar3,opt->blob_allocator);
        }
        else {
          pRVar33 = pRVar18;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar16,1,1,sVar3,opt->blob_allocator);
        }
        if (0 < (int)uVar16) {
          pvVar29 = bottom_blob->data;
          sVar38 = bottom_blob->cstep;
          pvVar41 = top_blob->data;
          lVar28 = 0;
          do {
            this = (Reduction *)((long)pvVar29 + lVar28);
            pRVar33 = pRVar19;
            fVar49 = reduction(fVar48,(float *)this,uVar1,uVar16,uVar25,(int)sVar38,local_18c);
            *(float *)((long)pvVar41 + lVar28) = fVar49;
            lVar28 = lVar28 + 4;
          } while ((long)pRVar18 * 4 - lVar28 != 0);
        }
      }
      if ((((byte)local_150 | local_d8) & 1) == 0 && !bVar44) {
        if (uVar32 == 0) {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar1,uVar25,sVar3,opt->blob_allocator);
        }
        else {
          this = (Reduction *)top_blob;
          Mat::create(top_blob,1,uVar1,uVar25,sVar3,opt->blob_allocator);
        }
        pRVar33 = pRVar19;
        if (0 < (int)uVar25) {
          sVar38 = bottom_blob->elemsize;
          if (uVar32 == 0) {
            sVar36 = (size_t)top_blob->w;
          }
          else {
            sVar36 = top_blob->cstep;
          }
          local_168 = (float *)bottom_blob->data;
          pvVar29 = top_blob->data;
          this = (Reduction *)(sVar36 * top_blob->elemsize);
          sVar36 = bottom_blob->cstep;
          pRVar34 = (Reduction *)0x0;
          do {
            if (0 < (int)uVar1) {
              pRVar33 = (Reduction *)0x0;
              pfVar39 = local_168;
              do {
                fVar49 = reduction(fVar48,pfVar39,uVar16,local_18c);
                *(float *)((long)pvVar29 + (long)pRVar33 * 4) = fVar49;
                pRVar33 = (Reduction *)((long)&(pRVar33->super_Layer)._vptr_Layer + 1);
                pfVar39 = pfVar39 + (int)uVar16;
              } while (pRVar19 != pRVar33);
            }
            pRVar34 = (Reduction *)((long)&(pRVar34->super_Layer)._vptr_Layer + 1);
            pvVar29 = (void *)((long)&(this->super_Layer)._vptr_Layer + (long)pvVar29);
            local_168 = (float *)((long)local_168 + sVar38 * sVar36);
            pRVar33 = pRVar19;
          } while (pRVar34 != pRVar22);
        }
      }
      if (((local_d8 | bStack_d0) & 1) == 0 && !bVar9) {
        if (uVar32 == 0) {
          pRVar33 = pRVar18;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar16,uVar1,sVar3,opt->blob_allocator);
        }
        else {
          pRVar33 = pRVar18;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar16,uVar1,1,sVar3,opt->blob_allocator);
        }
        if (0 < (int)uVar14) {
          pvVar29 = bottom_blob->data;
          sVar38 = bottom_blob->cstep;
          pvVar41 = top_blob->data;
          lVar28 = 0;
          do {
            this = (Reduction *)((long)pvVar29 + lVar28);
            pRVar33 = pRVar22;
            fVar49 = reduction(fVar48,(float *)this,uVar25,(int)sVar38,local_18c);
            *(float *)((long)pvVar41 + lVar28) = fVar49;
            lVar28 = lVar28 + 4;
          } while ((ulong)uVar14 << 2 != lVar28);
        }
      }
      if ((bVar12 & 1) == 0 && !bVar44) {
        if (uVar32 == 0) {
          pRVar33 = pRVar18;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar16,uVar25,sVar3,opt->blob_allocator);
        }
        else {
          pRVar33 = pRVar18;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar16,1,uVar25,sVar3,opt->blob_allocator);
        }
        if (0 < (int)uVar25) {
          sVar38 = bottom_blob->elemsize;
          if (uVar32 == 0) {
            sVar36 = (size_t)top_blob->w;
          }
          else {
            sVar36 = top_blob->cstep;
          }
          pvVar29 = bottom_blob->data;
          pvVar41 = top_blob->data;
          sVar4 = top_blob->elemsize;
          sVar5 = bottom_blob->cstep;
          pRVar34 = (Reduction *)0x0;
          do {
            if (0 < (int)uVar16) {
              lVar28 = 0;
              do {
                this = (Reduction *)(lVar28 + (long)pvVar29);
                pRVar33 = pRVar19;
                fVar49 = reduction(fVar48,(float *)this,uVar1,uVar16,local_18c);
                *(float *)((long)pvVar41 + lVar28) = fVar49;
                lVar28 = lVar28 + 4;
              } while ((long)pRVar18 * 4 != lVar28);
            }
            pRVar34 = (Reduction *)((long)&(pRVar34->super_Layer)._vptr_Layer + 1);
            pvVar41 = (void *)((long)pvVar41 + sVar36 * sVar4);
            pvVar29 = (void *)((long)pvVar29 + sVar38 * sVar5);
          } while (pRVar34 != pRVar22);
        }
      }
    }
    if (uVar21 != 4) {
      bVar9 = false;
      goto LAB_003273e2;
    }
    uVar16 = bottom_blob->w;
    pRVar34 = (Reduction *)(long)(int)uVar16;
    uVar1 = bottom_blob->h;
    pRVar18 = (Reduction *)(ulong)uVar1;
    uVar25 = bottom_blob->d;
    pRVar19 = (Reduction *)(ulong)uVar25;
    uVar14 = bottom_blob->c;
    pRVar22 = (Reduction *)(ulong)uVar14;
    uVar26 = uVar1 * uVar16;
    auVar54._8_4_ = 0xffffffff;
    auVar54._0_8_ = 0xffffffffffffffff;
    auVar54._12_4_ = 0xffffffff;
    auVar7._4_4_ = iVar59;
    auVar7._0_4_ = iVar15;
    auVar7[8] = bStack_d0;
    auVar7[9] = uStack_cf;
    auVar7._10_2_ = uStack_ce;
    auVar7._12_4_ = uVar60;
    auVar55._0_8_ = SUB168(auVar54 ^ auVar7,0) << 0x3f;
    auVar55._8_8_ = SUB168(auVar54 ^ auVar7,8) << 0x3f;
    iVar15 = movmskpd(uVar25,auVar55);
    bVar47 = iVar15 == 0;
    bVar46 = (bool)(bVar45 ^ 1);
    bVar9 = (bool)(bVar44 ^ 1);
    pRVar33 = pRVar34;
    if ((bVar47 && !bVar46) && (bVar44)) {
      if (uVar32 == 0) {
        Mat::create(top_blob,1,sVar3,opt->blob_allocator);
      }
      else {
        Mat::create(top_blob,1,1,1,1,sVar3,opt->blob_allocator);
      }
      local_98._64_8_ = 0;
      local_98._0_8_ = (Reduction *)0x0;
      local_98[8] = false;
      local_98[9] = false;
      local_98[10] = false;
      local_98[0xb] = false;
      local_98[0xc] = false;
      local_98[0xd] = false;
      local_98[0xe] = false;
      local_98[0xf] = false;
      local_98[0x10] = false;
      local_98[0x11] = false;
      local_98[0x12] = false;
      local_98[0x13] = false;
      local_98[0x14] = false;
      local_98[0x15] = false;
      local_98[0x16] = false;
      local_98[0x17] = false;
      local_98._24_4_ = 0;
      local_98._32_8_ = (Reduction *)0x0;
      local_98._40_4_ = 0;
      local_98._44_4_ = 0;
      local_98._48_4_ = 0;
      local_98._52_4_ = 0;
      local_98._56_4_ = 0;
      Mat::create((Mat *)local_98,uVar14,sVar3,opt->workspace_allocator);
      this = (Reduction *)local_98._0_8_;
      if (((Reduction *)local_98._0_8_ == (Reduction *)0x0) ||
         ((long)(int)local_98._56_4_ * local_98._64_8_ == 0)) {
        piVar8 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
        if (piVar8 == (int *)0x0) {
          return -100;
        }
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 != 0) {
          return -100;
        }
        if ((Reduction *)local_98._32_8_ != (Reduction *)0x0) {
          (*((Layer *)local_98._32_8_)->_vptr_Layer[3])();
          return -100;
        }
        goto LAB_003264ff;
      }
      if (0 < (int)uVar14) {
        pfVar39 = (float *)bottom_blob->data;
        sVar38 = bottom_blob->elemsize;
        sVar36 = bottom_blob->cstep;
        pRVar33 = (Reduction *)0x0;
        do {
          fVar49 = reduction(fVar48,pfVar39,uVar26 * uVar25,local_18c);
          *(float *)((long)&(this->super_Layer)._vptr_Layer + (long)pRVar33 * 4) = fVar49;
          pRVar33 = (Reduction *)((long)&(pRVar33->super_Layer)._vptr_Layer + 1);
          pfVar39 = (float *)((long)pfVar39 + sVar38 * sVar36);
        } while (pRVar22 != pRVar33);
      }
      pRVar33 = pRVar22;
      fVar49 = reduction(fVar48,(float *)this,uVar14,iVar31);
      *(float *)top_blob->data = fVar49;
      piVar8 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          this = (Reduction *)local_98._32_8_;
          pRVar33 = (Reduction *)local_98._0_8_;
          if ((Reduction *)local_98._32_8_ == (Reduction *)0x0) {
            if ((Reduction *)local_98._0_8_ != (Reduction *)0x0) {
              this = (Reduction *)local_98._0_8_;
              free((void *)local_98._0_8_);
            }
          }
          else {
            (*((Layer *)local_98._32_8_)->_vptr_Layer[3])();
          }
        }
      }
    }
    if ((bVar47 && !bVar46) && !bVar44) {
      if (uVar32 == 0) {
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar14,sVar3,opt->blob_allocator);
      }
      else {
        this = (Reduction *)top_blob;
        Mat::create(top_blob,1,1,1,uVar14,sVar3,opt->blob_allocator);
      }
      pRVar33 = (Reduction *)(ulong)uVar32;
      if (0 < (int)uVar14) {
        pRVar20 = (Reduction *)bottom_blob->data;
        sVar38 = bottom_blob->elemsize;
        pfVar39 = (float *)top_blob->data;
        sVar36 = top_blob->elemsize;
        sVar4 = top_blob->cstep;
        sVar5 = bottom_blob->cstep;
        pRVar37 = pRVar22;
        pfVar42 = pfVar39;
        do {
          pfVar40 = pfVar39;
          if (uVar32 == 0) {
            pfVar40 = pfVar42;
          }
          this = pRVar20;
          fVar49 = reduction(fVar48,(float *)pRVar20,uVar26 * uVar25,local_18c);
          pRVar33 = (Reduction *)(ulong)uVar32;
          *pfVar40 = fVar49;
          pfVar39 = (float *)((long)pfVar39 + sVar36 * sVar4);
          pfVar42 = pfVar42 + 1;
          pRVar20 = (Reduction *)((long)&(pRVar20->super_Layer)._vptr_Layer + sVar38 * sVar5);
          pRVar37 = (Reduction *)&pRVar37[-1].field_0x12f;
        } while (pRVar37 != (Reduction *)0x0);
      }
    }
    if ((bVar47 && !bVar45) && !bVar9) {
      if (uVar32 == 0) {
        pRVar33 = pRVar19;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar25,sVar3,opt->blob_allocator);
      }
      else {
        pRVar33 = (Reduction *)0x1;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,1,1,uVar25,1,sVar3,opt->blob_allocator);
      }
      if (0 < (int)uVar25) {
        iVar59 = bottom_blob->w;
        iVar2 = bottom_blob->h;
        pRVar20 = (Reduction *)bottom_blob->data;
        sVar36 = bottom_blob->cstep;
        pvVar29 = top_blob->data;
        sVar38 = bottom_blob->elemsize;
        pRVar37 = (Reduction *)0x0;
        do {
          pRVar33 = (Reduction *)(ulong)uVar26;
          this = pRVar20;
          fVar49 = reduction(fVar48,(float *)pRVar20,uVar26,uVar14,(int)sVar36,local_18c);
          *(float *)((long)pvVar29 + (long)pRVar37 * 4) = fVar49;
          pRVar37 = (Reduction *)((long)&(pRVar37->super_Layer)._vptr_Layer + 1);
          pRVar20 = (Reduction *)
                    ((long)&(pRVar20->super_Layer)._vptr_Layer + (long)iVar59 * sVar38 * (long)iVar2
                    );
        } while (pRVar19 != pRVar37);
      }
    }
    bVar12 = (byte)iVar15 >> 1 | local_d8;
    if (((bVar12 & 1) == 0 && !bVar46) && !bVar9) {
      if (uVar32 == 0) {
        Mat::create(top_blob,uVar1,sVar3,opt->blob_allocator);
      }
      else {
        Mat::create(top_blob,1,uVar1,1,1,sVar3,opt->blob_allocator);
      }
      this = (Reduction *)local_98;
      local_98._64_8_ = 0;
      local_98._0_8_ = (Reduction *)0x0;
      local_98[8] = false;
      local_98[9] = false;
      local_98[10] = false;
      local_98[0xb] = false;
      local_98[0xc] = false;
      local_98[0xd] = false;
      local_98[0xe] = false;
      local_98[0xf] = false;
      local_98[0x10] = false;
      local_98[0x11] = false;
      local_98[0x12] = false;
      local_98[0x13] = false;
      local_98[0x14] = false;
      local_98[0x15] = false;
      local_98[0x16] = false;
      local_98[0x17] = false;
      local_98._24_4_ = 0;
      local_98._32_8_ = (Reduction *)0x0;
      local_98._40_4_ = 0;
      local_98._44_4_ = 0;
      local_98._48_4_ = 0;
      local_98._52_4_ = 0;
      local_98._56_4_ = 0;
      pRVar33 = pRVar18;
      Mat::create((Mat *)this,uVar1,1,uVar14,sVar3,opt->workspace_allocator);
      uVar11 = local_98._64_8_;
      uVar10 = local_98._0_8_;
      if (((Reduction *)local_98._0_8_ == (Reduction *)0x0) ||
         ((long)(int)local_98._56_4_ * local_98._64_8_ == 0)) {
        piVar8 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
        if (piVar8 == (int *)0x0) {
          return -100;
        }
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 != 0) {
          return -100;
        }
        if ((Reduction *)local_98._32_8_ != (Reduction *)0x0) {
          (*((Layer *)local_98._32_8_)->_vptr_Layer[3])();
          return -100;
        }
LAB_003264ff:
        if ((Reduction *)local_98._0_8_ != (Reduction *)0x0) {
          free((void *)local_98._0_8_);
        }
        return -100;
      }
      if (0 < (int)uVar14) {
        local_150 = (float *)bottom_blob->data;
        sVar38 = bottom_blob->elemsize;
        sVar36 = bottom_blob->cstep;
        lVar28 = CONCAT44(local_98._20_4_,local_98._16_4_) * local_98._64_8_;
        pRVar20 = (Reduction *)0x0;
        this = (Reduction *)local_98._0_8_;
        do {
          if (0 < (int)uVar1) {
            pRVar37 = (Reduction *)0x0;
            pfVar39 = local_150;
            do {
              pRVar33 = (Reduction *)(ulong)uVar16;
              fVar49 = reduction(fVar48,pfVar39,uVar16,uVar25,uVar26,local_18c);
              *(float *)((long)&(this->super_Layer)._vptr_Layer + (long)pRVar37 * 4) = fVar49;
              pRVar37 = (Reduction *)((long)&(pRVar37->super_Layer)._vptr_Layer + 1);
              pfVar39 = pfVar39 + (long)pRVar34;
            } while (pRVar18 != pRVar37);
          }
          pRVar20 = (Reduction *)((long)&(pRVar20->super_Layer)._vptr_Layer + 1);
          this = (Reduction *)((long)&(this->super_Layer)._vptr_Layer + lVar28);
          local_150 = (float *)((long)local_150 + sVar38 * sVar36);
        } while (pRVar20 != pRVar22);
      }
      if (0 < (int)uVar1) {
        pvVar29 = top_blob->data;
        lVar28 = 0;
        do {
          this = (Reduction *)((long)&((Layer *)uVar10)->_vptr_Layer + lVar28);
          pRVar33 = pRVar22;
          fVar49 = reduction(fVar48,(float *)this,uVar14,(int)uVar11,iVar31);
          *(float *)((long)pvVar29 + lVar28) = fVar49;
          lVar28 = lVar28 + 4;
        } while ((long)pRVar18 * 4 != lVar28);
      }
      piVar8 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          this = (Reduction *)local_98._32_8_;
          pRVar33 = (Reduction *)local_98._0_8_;
          if ((Reduction *)local_98._32_8_ == (Reduction *)0x0) {
            if ((Reduction *)local_98._0_8_ != (Reduction *)0x0) {
              this = (Reduction *)local_98._0_8_;
              free((void *)local_98._0_8_);
            }
          }
          else {
            (*((Layer *)local_98._32_8_)->_vptr_Layer[3])();
          }
        }
      }
    }
    pRVar20 = (Reduction *)(ulong)uVar16;
    bVar13 = (byte)iVar15 | bStack_d0;
    if (((bVar13 & 1) == 0 && !bVar46) && !bVar9) {
      if (uVar32 == 0) {
        pRVar33 = pRVar20;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar16,sVar3,opt->blob_allocator);
      }
      else {
        pRVar33 = pRVar20;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar16,1,1,1,sVar3,opt->blob_allocator);
      }
      if (0 < (int)uVar16) {
        pvVar29 = bottom_blob->data;
        sVar38 = bottom_blob->cstep;
        pvVar41 = top_blob->data;
        lVar28 = 0;
        do {
          this = (Reduction *)((long)pvVar29 + lVar28);
          pRVar33 = (Reduction *)(ulong)(uVar1 * uVar25);
          fVar49 = reduction(fVar48,(float *)this,uVar1 * uVar25,uVar16,uVar14,(int)sVar38,local_18c
                            );
          *(float *)((long)pvVar41 + lVar28) = fVar49;
          lVar28 = lVar28 + 4;
        } while ((long)pRVar20 * 4 - lVar28 != 0);
      }
    }
    if ((bVar47 && !bVar45) && !bVar44) {
      if (uVar32 == 0) {
        pRVar33 = pRVar19;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar25,uVar14,sVar3,opt->blob_allocator);
      }
      else {
        pRVar33 = (Reduction *)0x1;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,1,1,uVar25,uVar14,sVar3,opt->blob_allocator);
      }
      if (0 < (int)uVar14) {
        sVar38 = bottom_blob->elemsize;
        if (uVar32 == 0) {
          sVar36 = (size_t)top_blob->w;
        }
        else {
          sVar36 = top_blob->cstep;
        }
        local_188 = (Reduction *)bottom_blob->data;
        pvVar29 = top_blob->data;
        pRVar33 = (Reduction *)(sVar36 * top_blob->elemsize);
        sVar36 = bottom_blob->cstep;
        pRVar37 = (Reduction *)0x0;
        do {
          if (0 < (int)uVar25) {
            pRVar30 = (Reduction *)0x0;
            pRVar35 = local_188;
            do {
              this = pRVar35;
              fVar49 = reduction(fVar48,(float *)pRVar35,uVar26,local_18c);
              *(float *)((long)pvVar29 + (long)pRVar30 * 4) = fVar49;
              pRVar30 = (Reduction *)((long)&(pRVar30->super_Layer)._vptr_Layer + 1);
              pRVar35 = (Reduction *)
                        ((long)&(pRVar35->super_Layer)._vptr_Layer + (long)(int)uVar26 * 4);
            } while (pRVar19 != pRVar30);
          }
          pRVar37 = (Reduction *)((long)&(pRVar37->super_Layer)._vptr_Layer + 1);
          pvVar29 = (void *)((long)&(pRVar33->super_Layer)._vptr_Layer + (long)pvVar29);
          local_188 = (Reduction *)((long)&(local_188->super_Layer)._vptr_Layer + sVar38 * sVar36);
        } while (pRVar37 != pRVar22);
      }
    }
    if (((bVar12 & 1) == 0 && !bVar45) && !bVar9) {
      if (uVar32 == 0) {
        pRVar33 = pRVar18;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar1,uVar25,sVar3,opt->blob_allocator);
      }
      else {
        pRVar33 = (Reduction *)0x1;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,1,uVar1,uVar25,1,sVar3,opt->blob_allocator);
      }
      if (0 < (int)uVar25) {
        this = (Reduction *)((long)bottom_blob->w * bottom_blob->elemsize);
        iVar15 = top_blob->w;
        iVar59 = bottom_blob->h;
        iVar31 = 1;
        if (uVar32 != 0) {
          iVar31 = top_blob->h;
        }
        pvVar29 = top_blob->data;
        local_130 = (float *)bottom_blob->data;
        sVar38 = top_blob->elemsize;
        sVar36 = bottom_blob->cstep;
        pRVar37 = (Reduction *)0x0;
        pRVar33 = (Reduction *)bottom_blob;
        do {
          if (0 < (int)uVar1) {
            pRVar35 = (Reduction *)0x0;
            pfVar39 = local_130;
            do {
              pRVar33 = (Reduction *)(ulong)uVar16;
              fVar49 = reduction(fVar48,pfVar39,uVar16,uVar14,(int)sVar36,local_18c);
              *(float *)((long)pvVar29 + (long)pRVar35 * 4) = fVar49;
              pRVar35 = (Reduction *)((long)&(pRVar35->super_Layer)._vptr_Layer + 1);
              pfVar39 = (float *)((long)pfVar39 + (long)this);
            } while (pRVar18 != pRVar35);
          }
          pRVar37 = (Reduction *)((long)&(pRVar37->super_Layer)._vptr_Layer + 1);
          pvVar29 = (void *)((long)pvVar29 + (long)iVar31 * sVar38 * (long)iVar15);
          local_130 = (float *)((long)local_130 + (long)iVar59 * (long)this);
        } while (pRVar37 != pRVar19);
      }
    }
    bVar23 = local_d8 | bStack_d0;
    if ((!bVar46 && (bVar23 & 1) == 0) && !bVar9) {
      if (uVar32 == 0) {
        pRVar33 = pRVar20;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar16,uVar1,sVar3,opt->blob_allocator);
      }
      else {
        pRVar33 = pRVar20;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar16,uVar1,1,1,sVar3,opt->blob_allocator);
      }
      if (0 < (int)uVar1) {
        this = (Reduction *)top_blob->data;
        pvVar29 = bottom_blob->data;
        iVar15 = bottom_blob->w;
        sVar36 = bottom_blob->cstep;
        pRVar35 = (Reduction *)((long)top_blob->w * top_blob->elemsize);
        sVar38 = bottom_blob->elemsize;
        pRVar37 = (Reduction *)0x0;
        pRVar33 = pRVar35;
        do {
          if (0 < (int)uVar16) {
            lVar28 = 0;
            do {
              pRVar33 = pRVar19;
              fVar49 = reduction(fVar48,(float *)((long)pvVar29 + lVar28),uVar25,uVar26,uVar14,
                                 (int)sVar36,local_18c);
              *(float *)((long)&(this->super_Layer)._vptr_Layer + lVar28) = fVar49;
              lVar28 = lVar28 + 4;
            } while ((long)pRVar20 * 4 - lVar28 != 0);
          }
          pRVar37 = (Reduction *)((long)&(pRVar37->super_Layer)._vptr_Layer + 1);
          this = (Reduction *)
                 ((long)&(this->super_Layer)._vptr_Layer + (long)&(pRVar35->super_Layer)._vptr_Layer
                 );
          pvVar29 = (void *)((long)pvVar29 + (long)iVar15 * sVar38);
        } while (pRVar37 != pRVar18);
      }
    }
    if (((bVar12 & 1) == 0 && !bVar46) && !bVar44) {
      if (uVar32 == 0) {
        pRVar33 = pRVar18;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar1,uVar14,sVar3,opt->blob_allocator);
      }
      else {
        pRVar33 = (Reduction *)0x1;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,1,uVar1,1,uVar14,sVar3,opt->blob_allocator);
      }
      if (0 < (int)uVar14) {
        sVar38 = bottom_blob->elemsize;
        if (uVar32 == 0) {
          sVar36 = (size_t)top_blob->w;
        }
        else {
          sVar36 = top_blob->cstep;
        }
        local_178 = (float *)bottom_blob->data;
        pvVar29 = top_blob->data;
        this = (Reduction *)(sVar36 * top_blob->elemsize);
        sVar36 = bottom_blob->cstep;
        pRVar37 = (Reduction *)0x0;
        pRVar33 = (Reduction *)bottom_blob;
        do {
          if (0 < (int)uVar1) {
            pRVar35 = (Reduction *)0x0;
            pfVar39 = local_178;
            do {
              pRVar33 = (Reduction *)(ulong)uVar16;
              fVar49 = reduction(fVar48,pfVar39,uVar16,uVar25,uVar26,local_18c);
              *(float *)((long)pvVar29 + (long)pRVar35 * 4) = fVar49;
              pRVar35 = (Reduction *)((long)&(pRVar35->super_Layer)._vptr_Layer + 1);
              pfVar39 = pfVar39 + (long)pRVar34;
            } while (pRVar18 != pRVar35);
          }
          pRVar37 = (Reduction *)((long)&(pRVar37->super_Layer)._vptr_Layer + 1);
          pvVar29 = (void *)((long)&(this->super_Layer)._vptr_Layer + (long)pvVar29);
          local_178 = (float *)((long)local_178 + sVar38 * sVar36);
        } while (pRVar37 != pRVar22);
      }
    }
    if (((bVar13 & 1) == 0 && !bVar45) && !bVar9) {
      if (uVar32 == 0) {
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar16,uVar25,sVar3,opt->blob_allocator);
      }
      else {
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar16,1,uVar25,1,sVar3,opt->blob_allocator);
      }
      pRVar33 = pRVar18;
      if (0 < (int)uVar25) {
        pvVar29 = top_blob->data;
        iVar15 = top_blob->w;
        iVar59 = bottom_blob->w;
        iVar31 = bottom_blob->h;
        pvVar41 = bottom_blob->data;
        sVar4 = bottom_blob->cstep;
        sVar38 = top_blob->elemsize;
        sVar36 = bottom_blob->elemsize;
        pRVar37 = (Reduction *)0x0;
        this = (Reduction *)bottom_blob;
        do {
          if (0 < (int)uVar16) {
            lVar28 = 0;
            do {
              this = (Reduction *)((long)pvVar41 + lVar28);
              fVar49 = reduction(fVar48,(float *)this,uVar1,uVar16,uVar14,(int)sVar4,local_18c);
              *(float *)((long)pvVar29 + lVar28) = fVar49;
              lVar28 = lVar28 + 4;
            } while ((long)pRVar20 * 4 != lVar28);
          }
          pRVar37 = (Reduction *)((long)&(pRVar37->super_Layer)._vptr_Layer + 1);
          pvVar29 = (void *)((long)pvVar29 + (long)iVar15 * sVar38);
          pvVar41 = (void *)((long)pvVar41 + (long)iVar31 * sVar36 * (long)iVar59);
        } while (pRVar37 != pRVar19);
      }
    }
    if (((bVar13 & 1) == 0 && !bVar46) && !bVar44) {
      if (uVar32 == 0) {
        pRVar33 = pRVar34;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar16,uVar14,sVar3,opt->blob_allocator);
      }
      else {
        pRVar33 = pRVar20;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar16,1,1,uVar14,sVar3,opt->blob_allocator);
      }
      if (0 < (int)uVar14) {
        sVar38 = bottom_blob->elemsize;
        if (uVar32 == 0) {
          sVar36 = (size_t)top_blob->w;
        }
        else {
          sVar36 = top_blob->cstep;
        }
        pvVar29 = bottom_blob->data;
        pvVar41 = top_blob->data;
        this = (Reduction *)(sVar36 * top_blob->elemsize);
        sVar36 = bottom_blob->cstep;
        pRVar37 = (Reduction *)0x0;
        do {
          if (0 < (int)uVar16) {
            lVar28 = 0;
            do {
              fVar49 = reduction(fVar48,(float *)((long)pvVar29 + lVar28),uVar25 * uVar1,uVar16,
                                 local_18c);
              *(float *)((long)pvVar41 + lVar28) = fVar49;
              lVar28 = lVar28 + 4;
            } while ((long)pRVar20 * 4 - lVar28 != 0);
          }
          pRVar33 = (Reduction *)(ulong)(uVar25 * uVar1);
          pRVar37 = (Reduction *)((long)&(pRVar37->super_Layer)._vptr_Layer + 1);
          pvVar41 = (void *)((long)&(this->super_Layer)._vptr_Layer + (long)pvVar41);
          pvVar29 = (void *)((long)pvVar29 + sVar38 * sVar36);
        } while (pRVar37 != pRVar22);
      }
    }
    if (((bVar12 & 1) == 0 && !bVar45) && !bVar44) {
      if (uVar32 == 0) {
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar1,uVar25,uVar14,sVar3,opt->blob_allocator);
        pRVar33 = pRVar18;
      }
      else {
        pRVar33 = (Reduction *)0x1;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,1,uVar1,uVar25,uVar14,sVar3,opt->blob_allocator);
      }
      if (0 < (int)uVar14) {
        local_150 = (float *)bottom_blob->data;
        sVar38 = bottom_blob->elemsize;
        pRVar33 = (Reduction *)top_blob->data;
        sVar36 = top_blob->elemsize;
        sVar4 = top_blob->cstep;
        sVar5 = bottom_blob->cstep;
        this = (Reduction *)0x0;
        do {
          if (0 < (int)(uVar1 * uVar25)) {
            uVar43 = 0;
            pfVar39 = local_150;
            do {
              fVar49 = reduction(fVar48,pfVar39,uVar16,local_18c);
              *(float *)((long)&(pRVar33->super_Layer)._vptr_Layer + uVar43 * 4) = fVar49;
              uVar43 = uVar43 + 1;
              pfVar39 = pfVar39 + (long)pRVar34;
            } while (uVar1 * uVar25 != uVar43);
          }
          this = (Reduction *)((long)&(this->super_Layer)._vptr_Layer + 1);
          pRVar33 = (Reduction *)((long)&(pRVar33->super_Layer)._vptr_Layer + sVar36 * sVar4);
          local_150 = (float *)((long)local_150 + sVar38 * sVar5);
        } while (this != pRVar22);
      }
    }
    if (((bVar23 & 1) == 0 && !bVar45) && !bVar9) {
      if (uVar32 == 0) {
        pRVar33 = pRVar34;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar16,uVar1,uVar25,sVar3,opt->blob_allocator);
      }
      else {
        pRVar33 = pRVar20;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar16,uVar1,uVar25,1,sVar3,opt->blob_allocator);
      }
      if (0 < (int)uVar25) {
        if (uVar32 == 0) {
          sVar38 = top_blob->cstep;
        }
        else {
          sVar38 = (long)top_blob->h * (long)top_blob->w;
        }
        pvVar29 = top_blob->data;
        pvVar41 = bottom_blob->data;
        sVar4 = bottom_blob->cstep;
        sVar36 = top_blob->elemsize;
        pRVar37 = (Reduction *)((long)bottom_blob->h * bottom_blob->elemsize * (long)bottom_blob->w)
        ;
        pRVar18 = (Reduction *)0x0;
        pRVar33 = (Reduction *)bottom_blob;
        this = pRVar37;
        do {
          if (0 < (int)uVar26) {
            lVar28 = 0;
            do {
              this = (Reduction *)((long)pvVar41 + lVar28);
              pRVar33 = pRVar22;
              fVar49 = reduction(fVar48,(float *)this,uVar14,(int)sVar4,local_18c);
              *(float *)((long)pvVar29 + lVar28) = fVar49;
              lVar28 = lVar28 + 4;
            } while ((ulong)uVar26 << 2 != lVar28);
          }
          pRVar18 = (Reduction *)((long)&(pRVar18->super_Layer)._vptr_Layer + 1);
          pvVar29 = (void *)((long)pvVar29 + sVar38 * sVar36);
          pvVar41 = (void *)((long)&(pRVar37->super_Layer)._vptr_Layer + (long)pvVar41);
        } while (pRVar18 != pRVar19);
      }
    }
    if (((bVar13 & 1) == 0 && !bVar45) && !bVar44) {
      if (uVar32 == 0) {
        pRVar33 = pRVar20;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar16,uVar25,uVar14,sVar3,opt->blob_allocator);
      }
      else {
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar16,1,uVar25,uVar14,sVar3,opt->blob_allocator);
        pRVar33 = pRVar34;
      }
      if (0 < (int)uVar14) {
        iVar15 = top_blob->w;
        local_f8 = (Reduction *)top_blob->data;
        sVar38 = top_blob->elemsize;
        iVar59 = bottom_blob->w;
        iVar31 = bottom_blob->h;
        local_e0 = bottom_blob->data;
        sVar36 = bottom_blob->elemsize;
        pRVar34 = (Reduction *)(top_blob->cstep * sVar38);
        sVar4 = bottom_blob->cstep;
        pRVar18 = (Reduction *)0x0;
        pRVar33 = pRVar34;
        this = (Reduction *)bottom_blob;
        do {
          if (0 < (int)uVar25) {
            pRVar33 = (Reduction *)0x0;
            this = local_f8;
            pvVar29 = local_e0;
            do {
              if (0 < (int)uVar16) {
                lVar28 = 0;
                do {
                  fVar49 = reduction(fVar48,(float *)((long)pvVar29 + lVar28),uVar1,uVar16,local_18c
                                    );
                  *(float *)((long)&(this->super_Layer)._vptr_Layer + lVar28) = fVar49;
                  lVar28 = lVar28 + 4;
                } while ((long)pRVar20 * 4 - lVar28 != 0);
              }
              pRVar33 = (Reduction *)((long)&(pRVar33->super_Layer)._vptr_Layer + 1);
              this = (Reduction *)((long)&(this->super_Layer)._vptr_Layer + (long)iVar15 * sVar38);
              pvVar29 = (void *)((long)pvVar29 + (long)iVar31 * sVar36 * (long)iVar59);
            } while (pRVar33 != pRVar19);
          }
          pRVar18 = (Reduction *)((long)&(pRVar18->super_Layer)._vptr_Layer + 1);
          local_f8 = (Reduction *)
                     ((long)&(local_f8->super_Layer)._vptr_Layer +
                     (long)&(pRVar34->super_Layer)._vptr_Layer);
          local_e0 = (void *)((long)local_e0 + sVar4 * sVar36);
        } while (pRVar18 != pRVar22);
      }
    }
    if ((!bVar46 && (bVar23 & 1) == 0) && !bVar44) {
      bVar9 = true;
      if (uVar32 == 0) {
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar16,uVar1,uVar14,sVar3,opt->blob_allocator);
      }
      else {
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar16,uVar1,1,uVar14,sVar3,opt->blob_allocator);
      }
      if ((int)uVar14 < 1) {
        bVar46 = false;
        bVar47 = false;
        pRVar33 = pRVar20;
        goto LAB_003273e2;
      }
      pvVar29 = bottom_blob->data;
      sVar3 = bottom_blob->elemsize;
      pvVar41 = top_blob->data;
      pRVar34 = (Reduction *)(top_blob->elemsize * top_blob->cstep);
      sVar38 = bottom_blob->cstep;
      pRVar18 = (Reduction *)0x0;
      pRVar33 = pRVar34;
      do {
        if (0 < (int)uVar26) {
          lVar28 = 0;
          do {
            this = (Reduction *)((long)pvVar29 + lVar28);
            pRVar33 = pRVar19;
            fVar49 = reduction(fVar48,(float *)this,uVar25,uVar26,local_18c);
            *(float *)((long)pvVar41 + lVar28) = fVar49;
            lVar28 = lVar28 + 4;
          } while ((ulong)uVar26 << 2 != lVar28);
        }
        pRVar18 = (Reduction *)((long)&(pRVar18->super_Layer)._vptr_Layer + 1);
        pvVar41 = (void *)((long)&(pRVar34->super_Layer)._vptr_Layer + (long)pvVar41);
        pvVar29 = (void *)((long)pvVar29 + sVar3 * sVar38);
      } while (pRVar18 != pRVar22);
    }
    bVar9 = true;
    bVar46 = false;
    bVar47 = false;
  }
LAB_003273e2:
  uVar32 = (uint)pRVar33;
  iVar15 = (int)this;
  if ((iVar17 - 9U < 2) && (uVar16 = top_blob->c * (int)top_blob->cstep, 0 < (int)uVar16)) {
    pvVar29 = top_blob->data;
    uVar43 = 0;
    do {
      fVar48 = logf(*(float *)((long)pvVar29 + uVar43 * 4));
      uVar32 = (uint)pRVar33;
      iVar15 = (int)this;
      *(float *)((long)pvVar29 + uVar43 * 4) = fVar48;
      uVar43 = uVar43 + 1;
    } while (uVar16 != uVar43);
  }
  if (iVar17 == 3) {
    iVar59 = bottom_blob->w;
    iVar17 = 1;
    if (uVar21 == 1) {
      iVar17 = iVar59;
    }
    if (bVar46) {
      auVar56._0_8_ = (ulong)local_d8 << 0x3f;
      auVar56._8_8_ = (ulong)bStack_d0 << 0x3f;
      uVar32 = movmskpd(uVar32,auVar56);
      iVar31 = 1;
      if ((uVar32 & 2) != 0) {
        iVar31 = iVar59;
      }
      iVar17 = iVar17 * iVar31;
      if ((uVar32 & 1) != 0) {
        iVar17 = iVar17 * bottom_blob->h;
      }
    }
    if (bVar47) {
      auVar57._0_8_ = (ulong)local_d8 << 0x3f;
      auVar57._8_8_ = (ulong)bStack_d0 << 0x3f;
      uVar21 = movmskpd(uVar32,auVar57);
      iVar31 = 1;
      iVar15 = 1;
      if ((uVar21 & 2) != 0) {
        iVar15 = iVar59;
      }
      if ((uVar21 & 1) != 0) {
        iVar31 = bottom_blob->h;
      }
      iVar17 = iVar17 * iVar15 * iVar31;
      if (bVar44) {
        iVar17 = iVar17 * bottom_blob->c;
      }
    }
    if (bVar9) {
      auVar58._0_8_ = (ulong)local_d8 << 0x3f;
      auVar58._8_8_ = (ulong)bStack_d0 << 0x3f;
      uVar21 = movmskpd(iVar15,auVar58);
      iVar15 = 1;
      if ((uVar21 & 2) == 0) {
        iVar59 = 1;
      }
      iVar31 = 1;
      if ((uVar21 & 1) != 0) {
        iVar31 = bottom_blob->h;
      }
      if (bVar45) {
        iVar15 = bottom_blob->d;
      }
      iVar17 = iVar17 * iVar59 * iVar15 * iVar31;
      if (bVar44) {
        iVar17 = iVar17 * bottom_blob->c;
      }
    }
    fVar62 = fVar62 / (float)iVar17;
  }
  else if ((iVar17 == 8) && (uVar21 = top_blob->c * (int)top_blob->cstep, 0 < (int)uVar21)) {
    pvVar29 = top_blob->data;
    uVar43 = 0;
    do {
      fVar48 = *(float *)((long)pvVar29 + uVar43 * 4);
      *(float *)((long)pvVar29 + uVar43 * 4) =
           SQRT((float)(~-(uint)(fVar48 < 1.1754944e-38) & (uint)fVar48));
      uVar43 = uVar43 + 1;
    } while (uVar21 != uVar43);
  }
  if ((fVar62 != 1.0) && (uVar21 = top_blob->c * (int)top_blob->cstep, 0 < (int)uVar21)) {
    pvVar29 = top_blob->data;
    uVar43 = 0;
    do {
      *(float *)((long)pvVar29 + uVar43 * 4) = *(float *)((long)pvVar29 + uVar43 * 4) * fVar62;
      uVar43 = uVar43 + 1;
    } while (uVar21 != uVar43);
  }
  return 0;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    int axes_flag[4] = {0};
    bool reduce_w = false;
    bool reduce_h = false;
    bool reduce_d = false;
    bool reduce_c = false;

    if (reduce_all)
    {
        reduce_w = true;
        reduce_h = true;
        reduce_d = true;
        reduce_c = true;
    }
    else
    {
        const int* axes_ptr = axes;
        int reduced_axes_num = axes.w;

        for (int i = 0; i < reduced_axes_num; i++)
        {
            int axis = axes_ptr[i];
            // handle negative axis
            if (axis < 0)
                axis += dims;
            axes_flag[axis] = 1;
        }

        if (dims == 1)
        {
            reduce_w = true;
        }
        else if (dims == 2)
        {
            if (axes_flag[0] == 1) reduce_h = true;
            if (axes_flag[1] == 1) reduce_w = true;
        }
        else if (dims == 3)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_h = true;
            if (axes_flag[2] == 1) reduce_w = true;
        }
        else if (dims == 4)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_d = true;
            if (axes_flag[2] == 1) reduce_h = true;
            if (axes_flag[3] == 1) reduce_w = true;
        }
    }

    return reduction_op(bottom_blob, top_blob, reduce_w, reduce_h, reduce_d, reduce_c, keepdims, operation, coeff, opt);
}